

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::Server::read_content_core
          (Server *this,Stream *strm,Request *req,Response *res,ContentReceiver *receiver,
          MultipartContentHeader *mulitpart_header,ContentReceiver *multipart_receiver)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t payload_max_length;
  bool bVar2;
  bool bVar3;
  int iVar4;
  const_iterator cVar5;
  char *__s;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar6;
  string boundary;
  ContentReceiverWithProgress out;
  MultipartFormDataParser multipart_form_data_parser;
  _Any_data local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Any_data local_1c8;
  code *local_1b8;
  undefined8 uStack_1b0;
  MultipartContentHeader *local_1a0;
  Stream *local_198;
  Server *local_190;
  _Any_data local_188;
  code *local_178;
  undefined8 uStack_170;
  _Any_data local_168;
  code *local_158;
  string local_148;
  MultipartFormDataParser local_128;
  anon_class_24_3_23d8765b local_48;
  
  local_128.boundary_._M_dataplus._M_p = (pointer)&local_128.boundary_.field_2;
  local_128.boundary_._M_string_length = 0;
  local_128.boundary_.field_2._M_local_buf[0] = '\0';
  local_128.state_ = 0;
  local_128.is_valid_ = false;
  local_128.file_.name._M_dataplus._M_p = (pointer)&local_128.file_.name.field_2;
  local_128.file_.name._M_string_length = 0;
  local_128.file_.name.field_2._M_local_buf[0] = '\0';
  local_128.file_.content._M_dataplus._M_p = (pointer)&local_128.file_.content.field_2;
  local_128.file_.content._M_string_length = 0;
  local_128.file_.content.field_2._M_local_buf[0] = '\0';
  local_128.file_.filename._M_dataplus._M_p = (pointer)&local_128.file_.filename.field_2;
  local_128.file_.filename._M_string_length = 0;
  local_128.file_.filename.field_2._M_local_buf[0] = '\0';
  local_128.file_.content_type._M_dataplus._M_p = (pointer)&local_128.file_.content_type.field_2;
  local_128.file_.content_type._M_string_length = 0;
  local_128.file_.content_type.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_128.buf_.field_2;
  local_128.buf_._M_string_length = 0;
  local_128.buf_.field_2._M_local_buf[0] = '\0';
  local_128.buf_spos_ = 0;
  local_128.buf_epos_ = 0;
  local_1b8 = (code *)0x0;
  uStack_1b0 = 0;
  local_1c8._M_unused._M_object = (void *)0x0;
  local_1c8._8_8_ = 0;
  local_198 = strm;
  local_190 = this;
  local_128.buf_._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = Request::is_multipart_form_data(req);
  if (bVar2) {
    local_1e8._M_unused._M_object = &local_1d8;
    local_1a0 = mulitpart_header;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Content-Type","");
    pVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::equal_range(&(req->headers)._M_t,(key_type *)&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_unused._0_8_ != &local_1d8) {
      operator_delete(local_1e8._M_unused._M_object,
                      CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1)
      ;
    }
    if (pVar6.first._M_node._M_node == pVar6.second._M_node._M_node) {
      __s = "";
    }
    else {
      __s = *(char **)(pVar6.first._M_node._M_node + 2);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,__s,(allocator<char> *)local_1e8._M_pod_data);
    local_1e8._8_8_ = 0;
    local_1d8._M_local_buf[0] = '\0';
    local_1e8._M_unused._M_object = &local_1d8;
    bVar2 = detail::parse_multipart_boundary(&local_148,(string *)&local_1e8);
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&local_128);
      local_48.multipart_receiver = multipart_receiver;
      local_48.mulitpart_header = local_1a0;
      local_48.multipart_form_data_parser = &local_128;
      std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
                ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)
                 local_1c8._M_pod_data,&local_48);
    }
    else {
      res->status = 400;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_unused._0_8_ != &local_1d8) {
      operator_delete(local_1e8._M_unused._M_object,
                      CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) goto LAB_001476ba;
  }
  else {
    std::function<bool_(const_char_*,_unsigned_long)>::function
              ((function<bool_(const_char_*,_unsigned_long)> *)&local_1e8,receiver);
    std::function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)>::operator=
              ((function<bool(char_const*,unsigned_long,unsigned_long,unsigned_long)> *)
               local_1c8._M_pod_data,(anon_class_32_1_b7b80f6d *)&local_1e8);
    if ((code *)CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) !=
        (code *)0x0) {
      (*(code *)CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]))
                (&local_1e8,&local_1e8,3);
    }
LAB_001476ba:
    iVar4 = std::__cxx11::string::compare((char *)req);
    if (iVar4 == 0) {
      local_1e8._M_unused._M_object = &local_1d8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Content-Length","");
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(req->headers)._M_t,(key_type *)&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_unused._0_8_ != &local_1d8) {
        operator_delete(local_1e8._M_unused._M_object,
                        CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) +
                        1);
      }
      if ((_Rb_tree_header *)cVar5._M_node == &(req->headers)._M_t._M_impl.super__Rb_tree_header) {
        bVar2 = true;
        goto LAB_001477dd;
      }
    }
    payload_max_length = local_190->payload_max_length_;
    local_178 = (code *)0x0;
    uStack_170 = 0;
    local_188._M_unused._M_object = (void *)0x0;
    local_188._8_8_ = 0;
    std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::function
              ((function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
               &local_168,
               (function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)> *)
               &local_1c8);
    bVar2 = detail::read_content<httplib::Request>
                      (local_198,req,payload_max_length,&res->status,(Progress *)&local_188,
                       (ContentReceiverWithProgress *)&local_168,true);
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,__destroy_functor);
    }
    if (local_178 != (code *)0x0) {
      (*local_178)(&local_188,&local_188,__destroy_functor);
    }
    if (bVar2) {
      bVar3 = Request::is_multipart_form_data(req);
      bVar2 = true;
      if ((!bVar3) || (local_128.is_valid_ != false)) goto LAB_001477dd;
      res->status = 400;
    }
  }
  bVar2 = false;
LAB_001477dd:
  if (local_1b8 != (code *)0x0) {
    (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.buf_._M_dataplus._M_p != paVar1) {
    operator_delete(local_128.buf_._M_dataplus._M_p,
                    CONCAT71(local_128.buf_.field_2._M_allocated_capacity._1_7_,
                             local_128.buf_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.file_.content_type._M_dataplus._M_p != &local_128.file_.content_type.field_2) {
    operator_delete(local_128.file_.content_type._M_dataplus._M_p,
                    CONCAT71(local_128.file_.content_type.field_2._M_allocated_capacity._1_7_,
                             local_128.file_.content_type.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.file_.filename._M_dataplus._M_p != &local_128.file_.filename.field_2) {
    operator_delete(local_128.file_.filename._M_dataplus._M_p,
                    CONCAT71(local_128.file_.filename.field_2._M_allocated_capacity._1_7_,
                             local_128.file_.filename.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.file_.content._M_dataplus._M_p != &local_128.file_.content.field_2) {
    operator_delete(local_128.file_.content._M_dataplus._M_p,
                    CONCAT71(local_128.file_.content.field_2._M_allocated_capacity._1_7_,
                             local_128.file_.content.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.file_.name._M_dataplus._M_p != &local_128.file_.name.field_2) {
    operator_delete(local_128.file_.name._M_dataplus._M_p,
                    CONCAT71(local_128.file_.name.field_2._M_allocated_capacity._1_7_,
                             local_128.file_.name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.boundary_._M_dataplus._M_p != &local_128.boundary_.field_2) {
    operator_delete(local_128.boundary_._M_dataplus._M_p,
                    CONCAT71(local_128.boundary_.field_2._M_allocated_capacity._1_7_,
                             local_128.boundary_.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

inline bool Server::read_content_core(Stream &strm, Request &req, Response &res,
                                      ContentReceiver receiver,
                                      MultipartContentHeader mulitpart_header,
                                      ContentReceiver multipart_receiver) {
  detail::MultipartFormDataParser multipart_form_data_parser;
  ContentReceiverWithProgress out;

  if (req.is_multipart_form_data()) {
    const auto &content_type = req.get_header_value("Content-Type");
    std::string boundary;
    if (!detail::parse_multipart_boundary(content_type, boundary)) {
      res.status = 400;
      return false;
    }

    multipart_form_data_parser.set_boundary(std::move(boundary));
    out = [&](const char *buf, size_t n, uint64_t /*off*/, uint64_t /*len*/) {
      /* For debug
      size_t pos = 0;
      while (pos < n) {
        auto read_size = (std::min)<size_t>(1, n - pos);
        auto ret = multipart_form_data_parser.parse(
            buf + pos, read_size, multipart_receiver, mulitpart_header);
        if (!ret) { return false; }
        pos += read_size;
      }
      return true;
      */
      return multipart_form_data_parser.parse(buf, n, multipart_receiver,
                                              mulitpart_header);
    };
  } else {
    out = [receiver](const char *buf, size_t n, uint64_t /*off*/,
                     uint64_t /*len*/) { return receiver(buf, n); };
  }

  if (req.method == "DELETE" && !req.has_header("Content-Length")) {
    return true;
  }

  if (!detail::read_content(strm, req, payload_max_length_, res.status, nullptr,
                            out, true)) {
    return false;
  }

  if (req.is_multipart_form_data()) {
    if (!multipart_form_data_parser.is_valid()) {
      res.status = 400;
      return false;
    }
  }

  return true;
}